

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O0

EC_POINT * OSSL::byteString2pt(ByteString *byteString,EC_GROUP *grp)

{
  int iVar1;
  size_t len_00;
  uchar *buf;
  ulong e;
  char *pcVar2;
  EC_GROUP *in_RSI;
  EC_POINT *pt;
  size_t len;
  ByteString raw;
  size_t in_stack_ffffffffffffff58;
  ByteString *in_stack_ffffffffffffff60;
  EC_POINT *local_8;
  
  DERUTIL::octet2Raw((ByteString *)raw._vptr_ByteString);
  len_00 = ByteString::size((ByteString *)0x1c4018);
  if (len_00 == 0) {
    local_8 = (EC_POINT *)0x0;
  }
  else {
    local_8 = EC_POINT_new(in_RSI);
    buf = ByteString::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    iVar1 = EC_POINT_oct2point(in_RSI,local_8,buf,len_00,(BN_CTX *)0x0);
    if (iVar1 == 0) {
      e = ERR_get_error();
      pcVar2 = ERR_error_string(e,(char *)0x0);
      softHSMLog(3,"byteString2pt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLUtil.cpp"
                 ,0x71,"EC_POINT_oct2point failed: %s",pcVar2);
      EC_POINT_free(local_8);
      local_8 = (EC_POINT *)0x0;
    }
  }
  ByteString::~ByteString((ByteString *)0x1c416b);
  return (EC_POINT *)local_8;
}

Assistant:

EC_POINT* OSSL::byteString2pt(const ByteString& byteString, const EC_GROUP* grp)
{
	ByteString raw = DERUTIL::octet2Raw(byteString);
	size_t len = raw.size();
	if (len == 0) return NULL;

	EC_POINT* pt = EC_POINT_new(grp);
	if (!EC_POINT_oct2point(grp, pt, &raw[0], len, NULL))
	{
		ERROR_MSG("EC_POINT_oct2point failed: %s", ERR_error_string(ERR_get_error(), NULL));
		EC_POINT_free(pt);
		return NULL;
	}
	return pt;
}